

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_65e8d::Av1Config_ReadWriteConfig_Test::TestBody
          (Av1Config_ReadWriteConfig_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_6;
  size_t i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  size_t bytes_read;
  AssertionResult gtest_ar_2;
  size_t i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint8_t av1c_buffer [4];
  size_t bytes_written;
  Av1Config av1_config;
  char (*in_stack_fffffffffffffe58) [40];
  AssertHelper *in_stack_fffffffffffffe60;
  Message *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  AssertHelper *in_stack_fffffffffffffe90;
  Av1Config *in_stack_fffffffffffffec0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  ulong uVar2;
  Message *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertionResult local_110 [2];
  AssertionResult local_f0 [2];
  int local_d0;
  undefined4 local_cc;
  AssertionResult local_c8;
  undefined8 local_b8;
  AssertionResult local_a0;
  ulong local_90;
  AssertionResult local_78;
  uint local_64;
  int local_40;
  undefined4 local_3c;
  AssertionResult local_38;
  uint8_t local_24 [4];
  size_t local_20;
  Av1Config local_15;
  
  memset(&local_15,0,0xd);
  local_20 = 0;
  memset(local_24,0,4);
  local_3c = 0;
  local_40 = write_av1config(&local_15,4,&local_20,local_24);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68,
             (int *)in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    testing::AssertionResult::failure_message((AssertionResult *)0x3b5296);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
               in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x3b52f3);
  }
  local_64 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b5377);
  if (local_64 == 0) {
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               (unsigned_long *)in_stack_fffffffffffffe68,(unsigned_long *)in_stack_fffffffffffffe60
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      testing::AssertionResult::failure_message((AssertionResult *)0x3b53f9);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                 in_stack_fffffffffffffe70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
      testing::Message::~Message((Message *)0x3b5456);
    }
    local_64 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b54dd);
    if (local_64 == 0) {
      for (local_90 = 0; local_90 < 4; local_90 = local_90 + 1) {
        testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                  (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                   (uchar *)in_stack_fffffffffffffe68,(uchar *)in_stack_fffffffffffffe60);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe90);
          testing::Message::operator<<
                    ((Message *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          in_stack_fffffffffffffe90 =
               (AssertHelper *)
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe60,
                          (unsigned_long *)in_stack_fffffffffffffe58);
          in_stack_fffffffffffffe88 =
               testing::AssertionResult::failure_message((AssertionResult *)0x3b55be);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                     in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                     in_stack_fffffffffffffe70);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
          testing::Message::~Message((Message *)0x3b5618);
        }
        local_64 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b569c);
        if (local_64 != 0) {
          return;
        }
      }
      local_b8 = 0;
      local_cc = 0;
      local_d0 = read_av1config((uint8_t *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                (size_t *)in_stack_fffffffffffffec8._M_head_impl,
                                in_stack_fffffffffffffec0);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 (int *)in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        in_stack_fffffffffffffe80 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3b5779);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                   in_stack_fffffffffffffe70);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
        testing::Message::~Message((Message *)0x3b57d6);
      }
      local_64 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b585a);
      if (local_64 == 0) {
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                   (unsigned_long *)in_stack_fffffffffffffe68,
                   (unsigned_long *)in_stack_fffffffffffffe60);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe90);
          in_stack_fffffffffffffe78 =
               testing::AssertionResult::failure_message((AssertionResult *)0x3b58dc);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                     in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                     in_stack_fffffffffffffe70);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
          testing::Message::~Message((Message *)0x3b5939);
        }
        local_64 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b59c0);
        if (local_64 == 0) {
          write_av1config(&local_15,4,&local_20,local_24);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     (int *)in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_110);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe90);
            in_stack_fffffffffffffe70 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x3b5a77);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                       in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                       in_stack_fffffffffffffe70);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
            testing::Message::~Message((Message *)0x3b5ad4);
          }
          local_64 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b5b5b);
          if (local_64 == 0) {
            for (uVar2 = 0; uVar2 < 4; uVar2 = uVar2 + 1) {
              testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                        (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                         (uchar *)in_stack_fffffffffffffe68,(uchar *)in_stack_fffffffffffffe60);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffec0);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffe90);
                in_stack_fffffffffffffe68 =
                     testing::Message::operator<<
                               ((Message *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                in_stack_fffffffffffffe60 =
                     (AssertHelper *)
                     testing::Message::operator<<
                               ((Message *)in_stack_fffffffffffffe60,
                                (unsigned_long *)in_stack_fffffffffffffe58);
                in_stack_fffffffffffffe58 =
                     (char (*) [40])
                     testing::AssertionResult::failure_message((AssertionResult *)0x3b5c1e);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffe90,
                           (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                           in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20)
                           ,in_stack_fffffffffffffe70);
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
                testing::Message::~Message((Message *)0x3b5c6a);
              }
              local_64 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b5ce2);
              if (local_64 != 0) {
                return;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(Av1Config, ReadWriteConfig) {
  Av1Config av1_config;
  memset(&av1_config, 0, sizeof(av1_config));

  // Test writing out the AV1 config.
  size_t bytes_written = 0;
  uint8_t av1c_buffer[4] = { 0 };
  ASSERT_EQ(0, write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written,
                               &av1c_buffer[0]));
  ASSERT_EQ(kAv1cNoConfigObusSize, bytes_written);
  for (size_t i = 0; i < kAv1cNoConfigObusSize; ++i) {
    ASSERT_EQ(kAv1cAllZero[i], av1c_buffer[i])
        << "Mismatch in output Av1Config at offset=" << i;
  }

  // Test reading the AV1 config.
  size_t bytes_read = 0;
  ASSERT_EQ(0, read_av1config(&kAv1cAllZero[0], sizeof(kAv1cAllZero),
                              &bytes_read, &av1_config));
  ASSERT_EQ(kAv1cNoConfigObusSize, bytes_read);
  ASSERT_EQ(0, write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written,
                               &av1c_buffer[0]));
  for (size_t i = 0; i < kAv1cNoConfigObusSize; ++i) {
    ASSERT_EQ(kAv1cAllZero[i], av1c_buffer[i])
        << "Mismatch in output Av1Config at offset=" << i;
  }
}